

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O3

bool re2::ChildArgsChanged(Regexp *re,Regexp **child_args)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  bool bVar7;
  
  uVar6 = (ulong)re->nsub_;
  if (uVar6 == 0) {
    return false;
  }
  if (re->nsub_ == 1) {
    paVar4 = &re->field_5;
  }
  else {
    paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
  }
  bVar7 = true;
  if (*child_args == (Regexp *)paVar4->submany_) {
    uVar5 = 0;
    do {
      if (uVar6 - 1 == uVar5) {
        uVar6 = 0;
        do {
          Regexp::Decref(child_args[uVar6]);
          uVar6 = uVar6 + 1;
        } while (uVar6 < re->nsub_);
        return false;
      }
      lVar2 = uVar5 + 1;
      uVar1 = uVar5 + 1;
      lVar3 = uVar5 + 1;
      uVar5 = uVar1;
    } while (child_args[lVar2] == (Regexp *)paVar4[lVar3].submany_);
    bVar7 = uVar1 < uVar6;
  }
  return bVar7;
}

Assistant:

static bool ChildArgsChanged(Regexp* re, Regexp** child_args) {
  for (int i = 0; i < re->nsub(); i++) {
    Regexp* sub = re->sub()[i];
    Regexp* newsub = child_args[i];
    if (newsub != sub)
      return true;
  }
  for (int i = 0; i < re->nsub(); i++) {
    Regexp* newsub = child_args[i];
    newsub->Decref();
  }
  return false;
}